

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&>::
MatchAndExplain(AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&> *this,
               FieldDescriptor **x,MatchResultListener *listener)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  string no_match_result;
  string result;
  StringMatchResultListener slistener;
  
  no_match_result._M_dataplus._M_p = (pointer)&no_match_result.field_2;
  no_match_result._M_string_length = 0;
  no_match_result.field_2._M_local_buf[0] = '\0';
  uVar4 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    uVar2 = ((long)(this->matchers_).
                   super__Vector_base<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    uVar4 = uVar4 + 1;
    if (uVar2 <= uVar4) {
      MatchResultListener::operator<<(listener,&no_match_result);
      break;
    }
    StringMatchResultListener::StringMatchResultListener(&slistener);
    bVar1 = MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>::MatchAndExplain
                      ((MatcherBase<const_google::protobuf::FieldDescriptor_*const_&> *)
                       ((long)&(((this->matchers_).
                                 super__Vector_base<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>).
                               super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                       lVar3),x,&slistener.super_MatchResultListener);
    if (bVar1) {
      std::__cxx11::stringbuf::str();
      MatchResultListener::operator<<(listener,&result);
    }
    else if (no_match_result._M_string_length == 0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&no_match_result,(string *)&result);
    }
    else {
      std::__cxx11::stringbuf::str();
      if (result._M_string_length != 0) {
        std::__cxx11::string::append((char *)&no_match_result);
        std::__cxx11::string::append((string *)&no_match_result);
      }
    }
    std::__cxx11::string::~string((string *)&result);
    lVar3 = lVar3 + 0x18;
    StringMatchResultListener::~StringMatchResultListener(&slistener);
  } while (!bVar1);
  std::__cxx11::string::~string((string *)&no_match_result);
  return uVar4 < uVar2;
}

Assistant:

bool MatchAndExplain(const T& x,
                       MatchResultListener* listener) const override {
    std::string no_match_result;

    // If either matcher1_ or matcher2_ matches x, we just need to
    // explain why *one* of them matches.
    for (size_t i = 0; i < matchers_.size(); ++i) {
      StringMatchResultListener slistener;
      if (matchers_[i].MatchAndExplain(x, &slistener)) {
        *listener << slistener.str();
        return true;
      } else {
        if (no_match_result.empty()) {
          no_match_result = slistener.str();
        } else {
          std::string result = slistener.str();
          if (!result.empty()) {
            no_match_result += ", and ";
            no_match_result += result;
          }
        }
      }
    }

    // Otherwise we need to explain why *both* of them fail.
    *listener << no_match_result;
    return false;
  }